

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

String * kj::_::operator*(String *__return_storage_ptr__,long *param_2,undefined8 param_3,
                         undefined8 param_4,ArrayPtr<const_char> *param_5)

{
  char *__s;
  StringPtr local_40;
  undefined8 local_30;
  long local_28;
  
  local_30 = *(undefined8 *)*param_2;
  local_28 = ((undefined8 *)*param_2)[1] + -1;
  __s = (char *)param_2[1];
  local_40.content.size_ = strlen(__s);
  local_40.content.ptr = __s;
  concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,(ArrayPtr<const_char> *)(param_2 + 2),&local_40,
             param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}